

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void google::protobuf::PlanAllocationSize
               (RepeatedPtrField<google::protobuf::DescriptorProto> *messages,
               size_t parent_scope_size,FlatAllocator *alloc)

{
  TypeMap<google::protobuf::(anonymous_namespace)::IntT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *pTVar1;
  Base<google::protobuf::MessageOptions> *pBVar2;
  Base<google::protobuf::OneofOptions> *pBVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  PointerT<char> pcVar7;
  Rep *pRVar8;
  int iVar9;
  long lVar10;
  RepeatedPtrFieldBase *pRVar11;
  RepeatedPtrFieldBase *pRVar12;
  void **ppvVar13;
  size_t parent_scope_size_00;
  protobuf local_50 [16];
  long local_40;
  void **local_38;
  
  anon_unknown_24::
  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ::PlanArray<google::protobuf::Descriptor>
            (&alloc->
              super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ,(messages->super_RepeatedPtrFieldBase).current_size_);
  ppvVar13 = (void **)messages;
  if (((ulong)(messages->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar8 = internal::RepeatedPtrFieldBase::rep(&messages->super_RepeatedPtrFieldBase);
    ppvVar13 = pRVar8->elements;
  }
  local_38 = (void **)messages;
  if (((ulong)(messages->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar8 = internal::RepeatedPtrFieldBase::rep(&messages->super_RepeatedPtrFieldBase);
    local_38 = pRVar8->elements;
  }
  local_38 = local_38 + (messages->super_RepeatedPtrFieldBase).current_size_;
  if (ppvVar13 == local_38) {
    return;
  }
  local_40 = parent_scope_size + 1;
  if (parent_scope_size == 0) {
    local_40 = 0;
  }
LAB_00f2f4f1:
  pvVar6 = *ppvVar13;
  parent_scope_size_00 =
       *(long *)((*(ulong *)((long)pvVar6 + 0xd8) & 0xfffffffffffffffc) + 8) + local_40;
  anon_unknown_24::
  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ::PlanArray<char>(&alloc->
                     super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                    ,(int)parent_scope_size_00 + 5);
  if (((*(uint *)((long)pvVar6 + 0x10) & 2) != 0) && (*(long *)((long)pvVar6 + 0xe0) == 0)) {
    internal::protobuf_assumption_failed
              ("!value || _impl_.options_ != nullptr",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
               ,0x36f8);
  }
  if ((*(uint *)((long)pvVar6 + 0x10) & 2) != 0) {
    if ((alloc->
        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
        ).pointers_.payload_.super_Base<char>.value != (PointerT<char>)0x0) goto LAB_00f2f734;
    pBVar2 = &(alloc->
              super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
              ).total_.payload_.super_Base<google::protobuf::MessageOptions>;
    pBVar2->value = pBVar2->value + 1;
  }
  PlanAllocationSize((RepeatedPtrField<google::protobuf::DescriptorProto> *)((long)pvVar6 + 0x30),
                     parent_scope_size_00,alloc);
  PlanAllocationSize((RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)
                     ((long)pvVar6 + 0x18),parent_scope_size_00,alloc);
  PlanAllocationSize((RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)
                     ((long)pvVar6 + 0x78),parent_scope_size_00,alloc);
  pRVar12 = (RepeatedPtrFieldBase *)((long)pvVar6 + 0x60);
  anon_unknown_24::
  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ::PlanArray<google::protobuf::Descriptor::ExtensionRange>
            (&alloc->
              super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ,*(int *)((long)pvVar6 + 0x68));
  pRVar11 = pRVar12;
  if ((*(byte *)((long)pvVar6 + 0x60) & 1) != 0) {
    pRVar8 = internal::RepeatedPtrFieldBase::rep(pRVar12);
    pRVar11 = (RepeatedPtrFieldBase *)pRVar8->elements;
  }
  if (((ulong)pRVar12->tagged_rep_or_elem_ & 1) != 0) {
    pRVar8 = internal::RepeatedPtrFieldBase::rep(pRVar12);
    pRVar12 = (RepeatedPtrFieldBase *)pRVar8->elements;
  }
  iVar4 = *(int *)((long)pvVar6 + 0x68);
  if (pRVar11 != (RepeatedPtrFieldBase *)(&pRVar12->tagged_rep_or_elem_ + iVar4)) {
    pcVar7 = (alloc->
             super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ).pointers_.payload_.super_Base<char>.value;
    iVar9 = (alloc->
            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ).total_.payload_.super_Base<google::protobuf::ExtensionRangeOptions>.value;
    do {
      uVar5 = *(uint *)((long)pRVar11->tagged_rep_or_elem_ + 0x10);
      if (((uVar5 & 1) != 0) && (*(long *)((long)pRVar11->tagged_rep_or_elem_ + 0x18) == 0))
      goto LAB_00f2f73e;
      if ((uVar5 & 1) != 0) {
        if (pcVar7 != (PointerT<char>)0x0) {
          PlanAllocationSize(local_50);
          goto LAB_00f2f716;
        }
        iVar9 = iVar9 + 1;
        (alloc->
        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
        ).total_.payload_.super_Base<google::protobuf::ExtensionRangeOptions>.value = iVar9;
      }
      pRVar11 = (RepeatedPtrFieldBase *)&pRVar11->current_size_;
    } while (pRVar11 != (RepeatedPtrFieldBase *)(&pRVar12->tagged_rep_or_elem_ + iVar4));
  }
  if ((alloc->
      super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ).pointers_.payload_.super_Base<char>.value != (PointerT<char>)0x0) goto LAB_00f2f720;
  pTVar1 = &(alloc->
            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ).total_;
  (pTVar1->payload_).super_Base<char>.value =
       (pTVar1->payload_).super_Base<char>.value + *(int *)((long)pvVar6 + 0xb0) * 8;
  (anonymous_namespace)::
  FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
  ::PlanArray<std::__cxx11::string_const*>
            ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
              *)alloc,*(int *)((long)pvVar6 + 200));
  (anonymous_namespace)::
  FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
  ::PlanArray<std::__cxx11::string>
            ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
              *)alloc,*(int *)((long)pvVar6 + 200));
  PlanAllocationSize((RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)
                     ((long)pvVar6 + 0x48),parent_scope_size_00,alloc);
  if ((alloc->
      super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ).pointers_.payload_.super_Base<char>.value == (PointerT<char>)0x0) goto code_r0x00f2f647;
  goto LAB_00f2f72a;
code_r0x00f2f647:
  pTVar1 = &(alloc->
            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ).total_;
  (pTVar1->payload_).super_Base<char>.value =
       (pTVar1->payload_).super_Base<char>.value + *(int *)((long)pvVar6 + 0x98) * 0x38;
  pRVar12 = (RepeatedPtrFieldBase *)((long)pvVar6 + 0x90);
  pRVar11 = pRVar12;
  if ((*(byte *)((long)pvVar6 + 0x90) & 1) != 0) {
    pRVar8 = internal::RepeatedPtrFieldBase::rep(pRVar12);
    pRVar11 = (RepeatedPtrFieldBase *)pRVar8->elements;
  }
  if (((ulong)pRVar12->tagged_rep_or_elem_ & 1) != 0) {
    pRVar8 = internal::RepeatedPtrFieldBase::rep(pRVar12);
    pRVar12 = (RepeatedPtrFieldBase *)pRVar8->elements;
  }
  iVar4 = *(int *)((long)pvVar6 + 0x98);
  if (pRVar11 != (RepeatedPtrFieldBase *)(&pRVar12->tagged_rep_or_elem_ + iVar4)) {
    lVar10 = parent_scope_size_00 + 1;
    if (parent_scope_size_00 == 0) {
      lVar10 = 0;
    }
    do {
      pvVar6 = pRVar11->tagged_rep_or_elem_;
      anon_unknown_24::
      FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ::PlanArray<char>(&alloc->
                         super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                        ,*(int *)((*(ulong *)((long)pvVar6 + 0x18) & 0xfffffffffffffffc) + 8) +
                         (int)lVar10 + 5);
      if (((*(uint *)((long)pvVar6 + 0x10) & 2) != 0) && (*(long *)((long)pvVar6 + 0x20) == 0)) {
        internal::protobuf_assumption_failed
                  ("!value || _impl_.options_ != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                   ,0x3c50);
      }
      if ((*(uint *)((long)pvVar6 + 0x10) & 2) != 0) {
        if ((alloc->
            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ).pointers_.payload_.super_Base<char>.value != (PointerT<char>)0x0) goto LAB_00f2f716;
        pBVar3 = &(alloc->
                  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                  ).total_.payload_.super_Base<google::protobuf::OneofOptions>;
        pBVar3->value = pBVar3->value + 1;
      }
      pRVar11 = (RepeatedPtrFieldBase *)&pRVar11->current_size_;
    } while (pRVar11 != (RepeatedPtrFieldBase *)(&pRVar12->tagged_rep_or_elem_ + iVar4));
  }
  ppvVar13 = ppvVar13 + 1;
  if (ppvVar13 == local_38) {
    return;
  }
  goto LAB_00f2f4f1;
LAB_00f2f716:
  PlanAllocationSize(local_50);
LAB_00f2f720:
  PlanAllocationSize(local_50);
LAB_00f2f72a:
  PlanAllocationSize(local_50);
LAB_00f2f734:
  PlanAllocationSize(local_50);
LAB_00f2f73e:
  internal::protobuf_assumption_failed
            ("!value || _impl_.options_ != nullptr",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
             ,0x34e5);
}

Assistant:

static void PlanAllocationSize(
    const RepeatedPtrField<DescriptorProto>& messages, size_t parent_scope_size,
    internal::FlatAllocator& alloc) {
  alloc.PlanArray<Descriptor>(messages.size());

  for (const auto& message : messages) {
    const size_t full_name_size =
        parent_scope_size ? parent_scope_size + 1 + message.name().size()
                          : message.name().size();
    alloc.PlanEntityNames(full_name_size);

    if (message.has_options()) alloc.PlanArray<MessageOptions>(1);
    PlanAllocationSize(message.nested_type(), full_name_size, alloc);
    PlanAllocationSize(message.field(), full_name_size, alloc);
    PlanAllocationSize(message.extension(), full_name_size, alloc);
    PlanAllocationSize(message.extension_range(), alloc);
    alloc.PlanArray<Descriptor::ReservedRange>(message.reserved_range_size());
    alloc.PlanArray<const std::string*>(message.reserved_name_size());
    alloc.PlanArray<std::string>(message.reserved_name_size());
    PlanAllocationSize(message.enum_type(), full_name_size, alloc);
    PlanAllocationSize(message.oneof_decl(), full_name_size, alloc);
  }
}